

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

void __thiscall
FIX::Message::setGroup
          (Message *this,string *msg,FieldBase *field,string *string,size_type *pos,FieldMap *map,
          DataDictionary *dataDictionary)

{
  int field_00;
  int iVar1;
  int iVar2;
  bool bVar3;
  _Rb_tree_header *p_Var4;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var5;
  Group *pGroup;
  message_order *order;
  _Base_ptr p_Var6;
  ulong uVar7;
  Group *pGVar8;
  _Base_ptr p_Var9;
  int delim;
  DataDictionary *pDD;
  FieldBase field_1;
  int local_ac;
  DataDictionary *local_a8;
  FieldMap *local_a0;
  _func_int **local_98;
  string *local_90;
  FieldBase local_88;
  
  field_00 = field->m_tag;
  local_a8 = (DataDictionary *)0x0;
  local_a0 = map;
  local_90 = msg;
  bVar3 = DataDictionary::getGroup(dataDictionary,msg,field_00,&local_ac,&local_a8);
  if (bVar3) {
    uVar7 = *pos;
    if (uVar7 < string->_M_string_length) {
      pGroup = (Group *)0x0;
      local_98 = (_func_int **)&PTR__FieldMap_001f9538;
      do {
        extractField(&local_88,this,string,pos,dataDictionary,dataDictionary,pGroup);
        pGVar8 = pGroup;
        if (local_88.m_tag != local_ac) {
          p_Var4 = &(local_a8->m_fields)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (local_a8->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 = &p_Var4->_M_header;
          for (; p_Var9 != (_Base_ptr)0x0;
              p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_88.m_tag]) {
            if (local_88.m_tag <= (int)p_Var9[1]._M_color) {
              p_Var6 = p_Var9;
            }
          }
          p_Var9 = &p_Var4->_M_header;
          if (((_Rb_tree_header *)p_Var6 != p_Var4) &&
             (p_Var9 = p_Var6, local_88.m_tag < (int)p_Var6[1]._M_color)) {
            p_Var9 = &p_Var4->_M_header;
          }
          if ((_Rb_tree_header *)p_Var9 != p_Var4) {
            if (pGroup == (Group *)0x0) goto LAB_0018d315;
            _Var5 = FieldMap::
                    lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                              (&pGroup->super_FieldMap,
                               (pGroup->super_FieldMap).m_fields.
                               super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (pGroup->super_FieldMap).m_fields.
                               super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>.
                               _M_impl.super__Vector_impl_data._M_finish,local_88.m_tag);
            if (_Var5._M_current !=
                (pGroup->super_FieldMap).m_fields.
                super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
                super__Vector_impl_data._M_finish) goto LAB_0018d234;
          }
          p_Var4 = &(local_a8->m_fields)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (local_a8->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 = &p_Var4->_M_header;
          for (; p_Var9 != (_Base_ptr)0x0;
              p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_88.m_tag]) {
            if (local_88.m_tag <= (int)p_Var9[1]._M_color) {
              p_Var6 = p_Var9;
            }
          }
          p_Var9 = &p_Var4->_M_header;
          if (((_Rb_tree_header *)p_Var6 != p_Var4) &&
             (p_Var9 = p_Var6, local_88.m_tag < (int)p_Var6[1]._M_color)) {
            p_Var9 = &p_Var4->_M_header;
          }
          if ((_Rb_tree_header *)p_Var9 != p_Var4) goto LAB_0018d37e;
          if (pGroup != (Group *)0x0) {
            FieldMap::addGroupPtr(local_a0,field_00,&pGroup->super_FieldMap,false);
            pGroup = (Group *)0x0;
          }
          *pos = uVar7;
LAB_0018d3e9:
          FieldBase::~FieldBase(&local_88);
          break;
        }
LAB_0018d234:
        if (pGroup != (Group *)0x0) {
          FieldMap::addGroupPtr(local_a0,field_00,&pGroup->super_FieldMap,false);
          pGVar8 = (Group *)0x0;
        }
LAB_0018d315:
        pGroup = (Group *)operator_new(0x78);
        iVar2 = local_88.m_tag;
        iVar1 = local_ac;
        order = DataDictionary::getOrderedFields(local_a8);
        FieldMap::FieldMap((FieldMap *)pGroup,order);
        (pGroup->super_FieldMap)._vptr_FieldMap = local_98;
        pGroup->m_field = iVar2;
        pGroup->m_delim = iVar1;
        if (pGVar8 != (Group *)0x0) {
          (*(pGVar8->super_FieldMap)._vptr_FieldMap[1])();
        }
LAB_0018d37e:
        if (pGroup == (Group *)0x0) goto LAB_0018d3e9;
        FieldMap::addField(&pGroup->super_FieldMap,&local_88);
        setGroup(this,local_90,&local_88,string,pos,&pGroup->super_FieldMap,local_a8);
        FieldBase::~FieldBase(&local_88);
        uVar7 = *pos;
      } while (uVar7 < string->_M_string_length);
    }
    else {
      pGroup = (Group *)0x0;
    }
    if (pGroup != (Group *)0x0) {
      (*(pGroup->super_FieldMap)._vptr_FieldMap[1])(pGroup);
    }
  }
  return;
}

Assistant:

void Message::setGroup(
    const std::string &msg,
    const FieldBase &field,
    const std::string &string,
    std::string::size_type &pos,
    FieldMap &map,
    const DataDictionary &dataDictionary) {
  int group = field.getTag();
  int delim;
  const DataDictionary *pDD = 0;
  if (!dataDictionary.getGroup(msg, group, delim, pDD)) {
    return;
  }
  std::unique_ptr<Group> pGroup;

  while (pos < string.size()) {
    std::string::size_type oldPos = pos;
    FieldBase field = extractField(string, pos, &dataDictionary, &dataDictionary, pGroup.get());

    // Start a new group because...
    if ( // found delimiter
        (field.getTag() == delim) ||
        // no delimiter, but field belongs to group OR field already processed
        (pDD->isField(field.getTag()) && (pGroup.get() == 0 || pGroup->isSetField(field.getTag())))) {
      if (pGroup.get()) {
        map.addGroupPtr(group, pGroup.release(), false);
      }
      pGroup.reset(new Group(field.getTag(), delim, pDD->getOrderedFields()));
    } else if (!pDD->isField(field.getTag())) {
      if (pGroup.get()) {
        map.addGroupPtr(group, pGroup.release(), false);
      }
      pos = oldPos;
      return;
    }

    if (!pGroup.get()) {
      return;
    }
    pGroup->addField(field);
    setGroup(msg, field, string, pos, *pGroup, *pDD);
  }
}